

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O1

void __thiscall CConsole::DeregisterTemp(CConsole *this,char *pName)

{
  CCommand *pCVar1;
  int iVar2;
  CCommand *pCVar3;
  CCommand *pCVar4;
  CCommand **ppCVar5;
  
  pCVar1 = this->m_pFirstCommand;
  if (pCVar1 != (CCommand *)0x0) {
    ppCVar5 = &this->m_pFirstCommand;
    if ((pCVar1->m_Temp == true) &&
       (iVar2 = str_comp((pCVar1->super_CCommandInfo).m_pName,pName), iVar2 == 0)) {
LAB_001bf0ea:
      pCVar4 = *ppCVar5;
      *ppCVar5 = pCVar4->m_pNext;
    }
    else {
      pCVar1 = *ppCVar5;
      pCVar3 = pCVar1->m_pNext;
      if (pCVar3 == (CCommand *)0x0) {
        pCVar4 = (CCommand *)0x0;
      }
      else {
        pCVar4 = (CCommand *)0x0;
        do {
          ppCVar5 = &pCVar1->m_pNext;
          if ((pCVar3->m_Temp == true) &&
             (iVar2 = str_comp((pCVar3->super_CCommandInfo).m_pName,pName), iVar2 == 0))
          goto LAB_001bf0ea;
          pCVar1 = *ppCVar5;
          pCVar3 = pCVar1->m_pNext;
        } while (pCVar3 != (CCommand *)0x0);
      }
    }
    if (pCVar4 != (CCommand *)0x0) {
      pCVar4->m_pNext = this->m_pRecycleList;
      this->m_pRecycleList = pCVar4;
    }
  }
  return;
}

Assistant:

void CConsole::DeregisterTemp(const char *pName)
{
	if(!m_pFirstCommand)
		return;

	CCommand *pRemoved = 0;

	// remove temp entry from command list
	if(m_pFirstCommand->m_Temp && str_comp(m_pFirstCommand->m_pName, pName) == 0)
	{
		pRemoved = m_pFirstCommand;
		m_pFirstCommand = m_pFirstCommand->m_pNext;
	}
	else
	{
		for(CCommand *pCommand = m_pFirstCommand; pCommand->m_pNext; pCommand = pCommand->m_pNext)
			if(pCommand->m_pNext->m_Temp && str_comp(pCommand->m_pNext->m_pName, pName) == 0)
			{
				pRemoved = pCommand->m_pNext;
				pCommand->m_pNext = pCommand->m_pNext->m_pNext;
				break;
			}
	}

	// add to recycle list
	if(pRemoved)
	{
		pRemoved->m_pNext = m_pRecycleList;
		m_pRecycleList = pRemoved;
	}
}